

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O3

void __thiscall getarg_tests::intarg::test_method(intarg *this)

{
  long lVar1;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long *plVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  ulong local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  int64_t local_390;
  lazy_ostream local_388;
  undefined1 *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  ulong *local_348;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_340;
  ulong **local_328;
  int64_t *local_320;
  char *local_318;
  char *local_310;
  assertion_result local_308;
  string local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  uint local_2b0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo",(allocator<char> *)&local_388);
  local_2b0 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-bar",(allocator<char> *)&local_388)
  ;
  local_288 = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_340,__l,(allocator_type *)&local_388);
  SetupArgs(&local_args,&local_340);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_340);
  lVar2 = -0x50;
  plVar5 = local_298;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xfb;
  file.m_begin = (iterator)&local_358;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_320 = &local_390;
  local_348 = &local_418;
  local_418 = CONCAT44(local_418._4_4_,0xb);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0xb);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_2c0._8_8_ = &local_320;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_328 = &local_348;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1b3,(size_t)&local_318,0xfb,(string *)local_2d0,
             "11",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xfc;
  file_00.m_begin = (iterator)&local_3a0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3b0,
             msg_00);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_418 = local_418 & 0xffffffff00000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1d4,(size_t)&local_318,0xfc,(string *)local_2d0,
             "0",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo -bar","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xff;
  file_01.m_begin = (iterator)&local_3c0;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3d0,
             msg_01);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_418 = local_418 & 0xffffffff00000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1b3,(size_t)&local_318,0xff,(string *)local_2d0,
             "0",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x100;
  file_02.m_begin = (iterator)&local_3e0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f0,
             msg_02);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-bar","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_418 = local_418 & 0xffffffff00000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1f4,(size_t)&local_318,0x100,(string *)local_2d0
             ,"0",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"-foo=-9223372036854775809 -bar=9223372036854775808","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x104;
  file_03.m_begin = (iterator)&local_400;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_410,
             msg_03);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_418 = 0x8000000000000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == -0x8000000000000000);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae428;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1d4,(size_t)&local_318,0x104,(string *)local_2d0
             ,"std::numeric_limits<int64_t>::min()",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x105;
  file_04.m_begin = (iterator)&local_428;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_438,
             msg_04);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-bar","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_418 = 0x7fffffffffffffff;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0x7fffffffffffffff);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae428;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d248,(size_t)&local_318,0x105,(string *)local_2d0
             ,"std::numeric_limits<int64_t>::max()",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo=11 -bar=12","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x108;
  file_05.m_begin = (iterator)&local_448;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_458,
             msg_05);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_418 = CONCAT44(local_418._4_4_,0xb);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0xb);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1d4,(size_t)&local_318,0x108,(string *)local_2d0
             ,"11",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x109;
  file_06.m_begin = (iterator)&local_468;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_478,
             msg_06);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-bar","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_418 = CONCAT44(local_418._4_4_,0xc);
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0xc);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1f4,(size_t)&local_318,0x109,(string *)local_2d0
             ,"12",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo=NaN -bar=NotANumber","")
  ;
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x10c;
  file_07.m_begin = (iterator)&local_488;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_498,
             msg_07);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,1);
  local_418 = local_418 & 0xffffffff00000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d291,(size_t)&local_318,0x10c,(string *)local_2d0
             ,"0",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x10d;
  file_08.m_begin = (iterator)&local_4a8;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4b8,
             msg_08);
  local_388.m_empty = false;
  local_388._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-bar","");
  local_390 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_418 = local_418 & 0xffffffff00000000;
  local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_390 == 0);
  local_308.m_message.px = (element_type *)0x0;
  local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_310 = "";
  local_320 = &local_390;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013ae428;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_320;
  local_348 = &local_418;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae248;
  local_340.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_328 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_308,&local_388,1,2,REQUIRE,0xe9d1f4,(size_t)&local_318,0x10d,(string *)local_2d0
             ,"0",&local_340);
  boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(intarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 11), 11);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), 0);

    ResetArgs(local_args, "-foo -bar");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 11), 0);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 0);

    // Check under-/overflow behavior.
    ResetArgs(local_args, "-foo=-9223372036854775809 -bar=9223372036854775808");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), std::numeric_limits<int64_t>::min());
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 0), std::numeric_limits<int64_t>::max());

    ResetArgs(local_args, "-foo=11 -bar=12");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), 11);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 12);

    ResetArgs(local_args, "-foo=NaN -bar=NotANumber");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 1), 0);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 0);
}